

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformfontdatabase.cpp
# Opt level: O0

QSupportedWritingSystems
QPlatformFontDatabase::writingSystemsFromTrueTypeBits(quint32 *unicodeRange,quint32 *codePageRange)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  uint *in_RDX;
  long in_RSI;
  QWritingSystemsPrivate *in_RDI;
  long in_FS_OFFSET;
  int flag;
  int index;
  int bit;
  int i;
  bool hasScript;
  QSupportedWritingSystems *writingSystems;
  undefined1 in_stack_ffffffffffffffab;
  WritingSystem in_stack_ffffffffffffffac;
  QWritingSystemsPrivate *other;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  int local_30;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  other = in_RDI;
  QSupportedWritingSystems::QSupportedWritingSystems((QSupportedWritingSystems *)in_RDI);
  bVar3 = false;
  for (local_30 = 0; local_30 < 0x22; local_30 = local_30 + 1) {
    bVar1 = requiredUnicodeBits[local_30][0];
    in_stack_ffffffffffffffc4 = 1 << (bVar1 & 0x1f);
    if ((bVar1 != 0x7e) &&
       ((*(uint *)(in_RSI + (long)(int)(bVar1 / 0x20) * 4) & in_stack_ffffffffffffffc4) != 0)) {
      bVar1 = requiredUnicodeBits[local_30][1];
      in_stack_ffffffffffffffc4 = 1 << (bVar1 & 0x1f);
      if ((bVar1 == 0x7f) ||
         ((*(uint *)(in_RSI + (long)(int)(bVar1 / 0x20) * 4) & in_stack_ffffffffffffffc4) != 0)) {
        QSupportedWritingSystems::setSupported
                  ((QSupportedWritingSystems *)in_RDI,in_stack_ffffffffffffffac,
                   (bool)in_stack_ffffffffffffffab);
        bVar3 = true;
      }
    }
  }
  if ((*in_RDX & 0x93) != 0) {
    QSupportedWritingSystems::setSupported
              ((QSupportedWritingSystems *)in_RDI,in_stack_ffffffffffffffac,
               (bool)in_stack_ffffffffffffffab);
    bVar3 = true;
  }
  if ((*in_RDX & 4) != 0) {
    QSupportedWritingSystems::setSupported
              ((QSupportedWritingSystems *)in_RDI,in_stack_ffffffffffffffac,
               (bool)in_stack_ffffffffffffffab);
    bVar3 = true;
  }
  if ((*in_RDX & 8) != 0) {
    QSupportedWritingSystems::setSupported
              ((QSupportedWritingSystems *)in_RDI,in_stack_ffffffffffffffac,
               (bool)in_stack_ffffffffffffffab);
    bVar3 = true;
  }
  if ((*in_RDX & 0x20) != 0) {
    QSupportedWritingSystems::setSupported
              ((QSupportedWritingSystems *)in_RDI,in_stack_ffffffffffffffac,
               (bool)in_stack_ffffffffffffffab);
    bVar3 = true;
  }
  if ((*in_RDX & 0x40) != 0) {
    QSupportedWritingSystems::setSupported
              ((QSupportedWritingSystems *)in_RDI,in_stack_ffffffffffffffac,
               (bool)in_stack_ffffffffffffffab);
    bVar3 = true;
  }
  if ((*in_RDX & 0x10000) != 0) {
    QSupportedWritingSystems::setSupported
              ((QSupportedWritingSystems *)in_RDI,in_stack_ffffffffffffffac,
               (bool)in_stack_ffffffffffffffab);
    bVar3 = true;
  }
  if ((*in_RDX & 0x100) != 0) {
    QSupportedWritingSystems::setSupported
              ((QSupportedWritingSystems *)in_RDI,in_stack_ffffffffffffffac,
               (bool)in_stack_ffffffffffffffab);
    bVar3 = true;
  }
  if ((*in_RDX & 0x40000) != 0) {
    QSupportedWritingSystems::setSupported
              ((QSupportedWritingSystems *)in_RDI,in_stack_ffffffffffffffac,
               (bool)in_stack_ffffffffffffffab);
    bVar3 = true;
  }
  if ((*in_RDX & 0x100000) != 0) {
    QSupportedWritingSystems::setSupported
              ((QSupportedWritingSystems *)in_RDI,in_stack_ffffffffffffffac,
               (bool)in_stack_ffffffffffffffab);
    bVar3 = true;
  }
  if ((*in_RDX & 0x20000) != 0) {
    QSupportedWritingSystems::setSupported
              ((QSupportedWritingSystems *)in_RDI,in_stack_ffffffffffffffac,
               (bool)in_stack_ffffffffffffffab);
    bVar3 = true;
  }
  if ((*in_RDX & 0x280000) != 0) {
    QSupportedWritingSystems::setSupported
              ((QSupportedWritingSystems *)in_RDI,in_stack_ffffffffffffffac,
               (bool)in_stack_ffffffffffffffab);
    bVar3 = true;
  }
  if ((*in_RDX & 0x80000000) != 0) {
    QSupportedWritingSystems::QSupportedWritingSystems((QSupportedWritingSystems *)in_RDI);
    QSupportedWritingSystems::operator=
              ((QSupportedWritingSystems *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (QSupportedWritingSystems *)other);
    QSupportedWritingSystems::~QSupportedWritingSystems((QSupportedWritingSystems *)in_RDI);
    bVar3 = false;
  }
  if (!bVar3) {
    QSupportedWritingSystems::setSupported
              ((QSupportedWritingSystems *)in_RDI,in_stack_ffffffffffffffac,
               (bool)in_stack_ffffffffffffffab);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (QSupportedWritingSystems)other;
  }
  __stack_chk_fail();
}

Assistant:

QSupportedWritingSystems QPlatformFontDatabase::writingSystemsFromTrueTypeBits(quint32 unicodeRange[4], quint32 codePageRange[2])
{
    QSupportedWritingSystems writingSystems;

    bool hasScript = false;
    for (int i = 0; i < QFontDatabase::WritingSystemsCount; ++i) {
        int bit = requiredUnicodeBits[i][0];
        int index = bit/32;
        int flag = 1 << (bit&31);
        if (bit != 126 && (unicodeRange[index] & flag)) {
            bit = requiredUnicodeBits[i][1];
            index = bit/32;

            flag = 1 << (bit&31);
            if (bit == 127 || (unicodeRange[index] & flag)) {
                writingSystems.setSupported(QFontDatabase::WritingSystem(i));
                hasScript = true;
                // qDebug("font %s: index=%d, flag=%8x supports script %d", familyName.latin1(), index, flag, i);
            }
        }
    }
    if (codePageRange[0] & ((1 << Latin1CsbBit) | (1 << CentralEuropeCsbBit) | (1 << TurkishCsbBit) | (1 << BalticCsbBit))) {
        writingSystems.setSupported(QFontDatabase::Latin);
        hasScript = true;
        //qDebug("font %s supports Latin", familyName.latin1());
    }
    if (codePageRange[0] & (1 << CyrillicCsbBit)) {
        writingSystems.setSupported(QFontDatabase::Cyrillic);
        hasScript = true;
        //qDebug("font %s supports Cyrillic", familyName.latin1());
    }
    if (codePageRange[0] & (1 << GreekCsbBit)) {
        writingSystems.setSupported(QFontDatabase::Greek);
        hasScript = true;
        //qDebug("font %s supports Greek", familyName.latin1());
    }
    if (codePageRange[0] & (1 << HebrewCsbBit)) {
        writingSystems.setSupported(QFontDatabase::Hebrew);
        hasScript = true;
        //qDebug("font %s supports Hebrew", familyName.latin1());
    }
    if (codePageRange[0] & (1 << ArabicCsbBit)) {
        writingSystems.setSupported(QFontDatabase::Arabic);
        hasScript = true;
        //qDebug("font %s supports Arabic", familyName.latin1());
    }
    if (codePageRange[0] & (1 << ThaiCsbBit)) {
        writingSystems.setSupported(QFontDatabase::Thai);
        hasScript = true;
        //qDebug("font %s supports Thai", familyName.latin1());
    }
    if (codePageRange[0] & (1 << VietnameseCsbBit)) {
        writingSystems.setSupported(QFontDatabase::Vietnamese);
        hasScript = true;
        //qDebug("font %s supports Vietnamese", familyName.latin1());
    }
    if (codePageRange[0] & (1 << SimplifiedChineseCsbBit)) {
        writingSystems.setSupported(QFontDatabase::SimplifiedChinese);
        hasScript = true;
        //qDebug("font %s supports Simplified Chinese", familyName.latin1());
    }
    if (codePageRange[0] & (1 << TraditionalChineseCsbBit)) {
        writingSystems.setSupported(QFontDatabase::TraditionalChinese);
        hasScript = true;
        //qDebug("font %s supports Traditional Chinese", familyName.latin1());
    }
    if (codePageRange[0] & (1 << JapaneseCsbBit)) {
        writingSystems.setSupported(QFontDatabase::Japanese);
        hasScript = true;
        //qDebug("font %s supports Japanese", familyName.latin1());
    }
    if (codePageRange[0] & ((1 << KoreanCsbBit) | (1 << KoreanJohabCsbBit))) {
        writingSystems.setSupported(QFontDatabase::Korean);
        hasScript = true;
        //qDebug("font %s supports Korean", familyName.latin1());
    }
    if (codePageRange[0] & (1U << SymbolCsbBit)) {
        writingSystems = QSupportedWritingSystems();
        hasScript = false;
    }

    if (!hasScript)
        writingSystems.setSupported(QFontDatabase::Symbol);

    return writingSystems;
}